

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  short in_DX;
  ulong *in_RSI;
  long in_RDI;
  Expr *pRight;
  LogEst iReduce;
  int k;
  int j;
  int i;
  Bitmask notAllowed;
  WhereTerm *pX;
  WhereTerm *pTerm;
  undefined2 in_stack_ffffffffffffffc0;
  short sVar6;
  int in_stack_ffffffffffffffc4;
  uint uVar7;
  long local_20;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  sVar6 = 0;
  iVar5 = *(int *)(in_RDI + 0x14);
  local_20 = *(long *)(in_RDI + 0x20);
  do {
    if ((iVar5 < 1) || ((*(ushort *)(local_20 + 0x12) & 2) != 0)) {
      if ((int)in_DX - (int)sVar6 < (int)*(short *)((long)in_RSI + 0x16)) {
        *(short *)((long)in_RSI + 0x16) = in_DX - sVar6;
      }
      return;
    }
    if (((*(ulong *)(local_20 + 0x38) & in_RSI[1]) != 0) &&
       ((*(ulong *)(local_20 + 0x38) & ((uVar1 | uVar2) ^ 0xffffffffffffffff)) == 0)) {
      uVar7 = (uint)*(ushort *)((long)in_RSI + 0x2c);
      while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
        lVar3 = *(long *)(in_RSI[7] + (long)(int)uVar7 * 8);
        if ((lVar3 != 0) &&
           ((lVar3 == local_20 ||
            ((-1 < *(int *)(lVar3 + 0x18) &&
             (*(long *)(in_RDI + 0x20) + (long)*(int *)(lVar3 + 0x18) * 0x40 == local_20))))))
        break;
      }
      if ((int)uVar7 < 0) {
        if (*(short *)(local_20 + 0x10) < 1) {
          *(short *)((long)in_RSI + 0x16) =
               *(short *)((long)in_RSI + 0x16) + *(short *)(local_20 + 0x10);
        }
        else {
          *(short *)((long)in_RSI + 0x16) = *(short *)((long)in_RSI + 0x16) + -1;
          if ((*(ushort *)(local_20 + 0x14) & 0x82) != 0) {
            iVar4 = sqlite3ExprIsInteger
                              ((Expr *)CONCAT44(iVar5,uVar7),
                               (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                               CONCAT22(sVar6,in_stack_ffffffffffffffc0)));
            if (((iVar4 == 0) || (in_stack_ffffffffffffffc4 < -1)) ||
               (1 < in_stack_ffffffffffffffc4)) {
              in_stack_ffffffffffffffc4 = 0x14;
            }
            else {
              in_stack_ffffffffffffffc4 = 10;
            }
            if (sVar6 < in_stack_ffffffffffffffc4) {
              sVar6 = (short)in_stack_ffffffffffffffc4;
            }
          }
        }
      }
    }
    iVar5 = iVar5 + -1;
    local_20 = local_20 + 0x40;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j, k;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nTerm, pTerm=pWC->a; i>0; i--, pTerm++){
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) break;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( pTerm->eOperator&(WO_EQ|WO_IS) ){
          Expr *pRight = pTerm->pExpr->pRight;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ) iReduce = k;
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce )  pLoop->nOut = nRow - iReduce;
}